

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int BrotliEncoderCompress
              (int quality,int lgwin,BrotliEncoderMode mode,size_t input_size,uint8_t *input_buffer,
              size_t *encoded_size,uint8_t *encoded_buffer)

{
  int *piVar1;
  uint8_t prev_byte2;
  uint8_t prev_byte;
  uint32_t num_distance_codes;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_t i_1;
  ulong uVar5;
  BrotliEncoderState *s;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  Command *cmds;
  uint8_t *puVar9;
  char cVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  BrotliEncoderParams *pBVar23;
  ulong uVar24;
  int *__s;
  size_t *psVar25;
  Command *__src;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong num_bytes;
  size_t sVar29;
  ulong uVar30;
  long lVar31;
  HasherCommon *common;
  ulong uVar32;
  ulong uVar33;
  byte bVar34;
  ulong local_360;
  ulong local_358;
  ulong local_350;
  ulong local_348;
  size_t local_340;
  size_t local_338;
  ulong local_330;
  int dist_cache [4];
  ulong local_310;
  ulong local_300;
  ulong local_2f8;
  size_t num_literals;
  undefined8 local_2e8;
  size_t local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  ZopfliNode *local_2c8;
  ulong local_2c0;
  int *local_2b8;
  ulong local_2b0;
  MemoryManager memory_manager;
  uint8_t *local_280;
  size_t last_insert_len;
  BrotliEncoderParams params;
  int saved_dist_cache [4];
  size_t available_in;
  BlockSplit local_160;
  BlockSplit local_130;
  uint32_t *local_100;
  size_t sStack_f8;
  uint32_t *local_f0;
  size_t sStack_e8;
  HistogramLiteral *local_e0;
  size_t sStack_d8;
  HistogramCommand *local_d0;
  size_t sStack_c8;
  HistogramDistance *local_c0;
  size_t sStack_b8;
  size_t available_out;
  uint local_70;
  
  bVar34 = 0;
  local_340 = *encoded_size;
  if (input_size == 0) {
    uVar15 = 2;
  }
  else {
    uVar5 = input_size + (input_size >> 0xe) * 4 + 6;
    uVar15 = 0;
    if (input_size <= uVar5) {
      uVar15 = uVar5;
    }
  }
  if (local_340 == 0) {
    return 0;
  }
  if (input_size == 0) {
    *encoded_size = 1;
    *encoded_buffer = '\x06';
    return 1;
  }
  if (quality != 10) {
    s = BrotliEncoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
    if (s == (BrotliEncoderState *)0x0) {
      return 0;
    }
    available_out = *encoded_size;
    memory_manager.alloc_func = (brotli_alloc_func)encoded_buffer;
    dist_cache[0] = 0;
    dist_cache[1] = 0;
    iVar4 = s->is_initialized_;
    if (iVar4 == 0) {
      (s->params).quality = quality;
      (s->params).lgwin = lgwin;
      (s->params).mode = mode;
      (s->params).size_hint = input_size & 0xffffffff;
    }
    if (0x18 < lgwin && iVar4 == 0) {
      (s->params).large_window = 1;
    }
    params._0_8_ = input_buffer;
    available_in = input_size;
    iVar4 = BrotliEncoderCompressStream
                      (s,BROTLI_OPERATION_FINISH,&available_in,(uint8_t **)&params,&available_out,
                       (uint8_t **)&memory_manager,(size_t *)dist_cache);
    if (s->stream_state_ == BROTLI_STREAM_FINISHED) {
      sVar21 = s->available_out_;
      *encoded_size = dist_cache._0_8_;
      BrotliEncoderDestroyInstance(s);
      if ((iVar4 != 0) && (sVar21 == 0)) {
        if (uVar15 == 0) {
          return 1;
        }
        if (*encoded_size <= uVar15) {
          return 1;
        }
      }
    }
    else {
      *encoded_size = dist_cache._0_8_;
      BrotliEncoderDestroyInstance(s);
    }
    goto LAB_00125db4;
  }
  uVar3 = 0x10;
  if (0x10 < lgwin) {
    uVar3 = lgwin;
  }
  uVar5 = 0x1e;
  if ((int)uVar3 < 0x1e) {
    uVar5 = (ulong)uVar3;
  }
  uVar14 = (uint)uVar5;
  local_2d0 = 1L << ((byte)uVar5 & 0x3f);
  dist_cache[0] = 4;
  dist_cache[1] = 0xb;
  dist_cache[2] = 0xf;
  dist_cache[3] = 0x10;
  uVar11 = local_2d0;
  if (input_size < local_2d0) {
    uVar11 = input_size;
  }
  cVar10 = '\x17';
  if ((int)uVar3 < 0x17) {
    cVar10 = (char)uVar3;
  }
  uVar16 = 1L << (cVar10 + 1U & 0x3f);
  saved_dist_cache[0] = 4;
  saved_dist_cache[1] = 0xb;
  saved_dist_cache[2] = 0xf;
  saved_dist_cache[3] = 0x10;
  params.mode = BROTLI_MODE_GENERIC;
  params.quality = 0xb;
  params.large_window = 0;
  params.lgwin = 0x16;
  params.lgblock = 0;
  params.size_hint._0_4_ = 0;
  params.size_hint._4_4_ = 0;
  params.disable_literal_context_modeling = 0;
  BrotliInitEncoderDictionary(&params.dictionary);
  params.dist.distance_postfix_bits = 0;
  params.dist.num_direct_distance_codes = 0;
  params.dist.alphabet_size = 0x40;
  params.dist.max_distance = 0x3fffffc;
  if (0x18 < lgwin) {
    params.large_window = 1;
  }
  params.quality = 10;
  uVar3 = 0x1e;
  if (params.large_window == 0) {
    uVar3 = 0x18;
  }
  params.lgwin = uVar14;
  if (uVar3 < uVar14) {
    params.lgwin = uVar3;
  }
  if (params.lgblock == 0) {
    params.lgblock = 0x10;
    if ((0x10 < params.lgwin) && (params.lgblock = 0x12, params.lgwin < 0x12)) {
      params.lgblock = params.lgwin;
    }
  }
  else {
    iVar4 = 0x10;
    if (0x10 < params.lgblock) {
      iVar4 = params.lgblock;
    }
    params.lgblock = 0x18;
    if (iVar4 < 0x18) {
      params.lgblock = iVar4;
    }
  }
  ChooseDistanceParams(&params);
  uVar6 = 1L << ((byte)params.lgblock & 0x3f);
  BrotliInitMemoryManager(&memory_manager,(brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
  if (params.large_window == 0) {
    uVar24 = 1;
    if (uVar14 == 0x10) {
      local_348 = 0;
    }
    else if (uVar14 == 0x11) {
      uVar24 = 7;
      local_348 = CONCAT62((int6)(uVar5 >> 0x10),1);
    }
    else if (lgwin < 0x12) {
      local_348 = (ulong)(uVar14 * 0x10 - 0x7f);
      uVar24 = 7;
    }
    else {
      local_348 = (ulong)(uVar14 * 2 - 0x21);
      uVar24 = 4;
    }
  }
  else {
    local_348 = (ulong)(uVar14 << 8 | 0x11);
    uVar24 = 0xe;
  }
  if (params.quality < 10) {
    if (CONCAT44(params.size_hint._4_4_,(undefined4)params.size_hint) < 0x100000 ||
        params.quality != 4) {
      if (params.quality < 5) {
        params.hasher.type = params.quality;
      }
      else if (params.lgwin < 0x11) {
        params.hasher.type = 0x28;
        if (6 < params.quality) {
          params.hasher.type = (params.quality == 9) + 0x29;
        }
      }
      else {
        params.hasher.block_bits = params.quality + -1;
        if (params.lgwin < 0x13 ||
            CONCAT44(params.size_hint._4_4_,(undefined4)params.size_hint) < 0x100000) {
          iVar4 = 10;
          if (params.quality == 9) {
            iVar4 = 0x10;
          }
          params.hasher.num_last_distances_to_check = 4;
          if (6 < params.quality) {
            params.hasher.num_last_distances_to_check = iVar4;
          }
          params.hasher._0_8_ = (ulong)CONCAT14(params.quality < 7,5) ^ 0xf00000000;
        }
        else {
          params.hasher.type = 6;
          params.hasher.bucket_bits = 0xf;
          params.hasher.hash_len = 5;
          iVar4 = 10;
          if (params.quality == 9) {
            iVar4 = 0x10;
          }
          params.hasher.num_last_distances_to_check = 4;
          if (6 < params.quality) {
            params.hasher.num_last_distances_to_check = iVar4;
          }
        }
      }
    }
    else {
      params.hasher.type = 0x36;
    }
  }
  else {
    params.hasher.type = 10;
  }
  sVar21 = 0x28;
  if (params.hasher.type < 0x28) {
    switch(params.hasher.type) {
    case 2:
      sVar21 = 0x4002c;
      break;
    case 3:
      sVar21 = 0x40030;
      break;
    case 4:
switchD_00124ce7_caseD_4:
      sVar21 = 0x80038;
      break;
    case 5:
      sVar21 = ((4L << ((byte)params.hasher.block_bits & 0x3f) | 2U) <<
               ((byte)params.hasher.bucket_bits & 0x3f)) + 0x40;
      break;
    case 6:
      sVar21 = ((4L << ((byte)params.hasher.block_bits & 0x3f) | 2U) <<
               ((byte)params.hasher.bucket_bits & 0x3f)) + 0x50;
      break;
    case 10:
      uVar5 = 1L << ((byte)params.lgwin & 0x3f);
      if (uVar11 <= uVar5) {
        uVar5 = uVar11;
      }
      sVar21 = uVar5 * 8 + 0x80038;
    }
  }
  else if (params.hasher.type < 0x2a) {
    if ((params.hasher.type == 0x28) || (params.hasher.type == 0x29)) goto switchD_00124ce7_caseD_4;
  }
  else if (params.hasher.type == 0x2a) {
    sVar21 = 0x140430;
  }
  else if (params.hasher.type == 0x36) {
    sVar21 = 0x400038;
  }
  if (sVar21 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)BrotliAllocate(&memory_manager,sVar21);
  }
  piVar7[0] = params.hasher.type;
  piVar7[1] = params.hasher.bucket_bits;
  *(ulong *)(piVar7 + 2) = CONCAT44(params.hasher.hash_len,params.hasher.block_bits);
  piVar7[4] = params.hasher.num_last_distances_to_check;
  iVar4 = *piVar7;
  if (iVar4 < 0x28) {
    if (iVar4 == 5) {
      piVar7[0xe] = 0x20 - piVar7[1];
      *(long *)(piVar7 + 10) = 1L << ((byte)piVar7[1] & 0x3f);
      lVar27 = 1L << (*(byte *)(piVar7 + 2) & 0x3f);
      *(long *)(piVar7 + 0xc) = lVar27;
      piVar7[0xf] = (int)lVar27 + -1;
    }
    else if (iVar4 == 6) {
      piVar7[0xe] = 0x40 - piVar7[1];
      *(ulong *)(piVar7 + 0x10) = 0xffffffffffffffff >> ((char)piVar7[3] * -8 & 0x3fU);
      *(long *)(piVar7 + 10) = 1L << ((byte)piVar7[1] & 0x3f);
      lVar27 = 1L << (*(byte *)(piVar7 + 2) & 0x3f);
      *(long *)(piVar7 + 0xc) = lVar27;
      piVar7[0x12] = (int)lVar27 + -1;
    }
    else if (iVar4 == 10) {
      uVar3 = -1 << ((byte)params.lgwin & 0x1f);
      *(ulong *)(piVar7 + 10) = (ulong)~uVar3;
      piVar7[0x2000c] = uVar3 + 1;
    }
  }
  else if ((iVar4 == 0x28) || (iVar4 == 0x29)) {
    *(ulong *)(piVar7 + 0x2000c) =
         (ulong)((params.quality < 7) + 7 << ((char)params.quality - 4U & 0x1f));
  }
  else if (iVar4 == 0x2a) {
    *(ulong *)(piVar7 + 0x5010a) =
         (ulong)((params.quality < 7) + 7 << ((char)params.quality - 4U & 0x1f));
  }
  if (piVar7 != (int *)0x0) {
    piVar7[5] = 0;
  }
  if (piVar7[5] == 0) {
    if (iVar4 < 0x28) {
      switch(iVar4) {
      case 2:
        __s = piVar7 + 10;
        if (uVar11 < 0x801) {
          uVar5 = 0;
          do {
            __s[(ulong)(*(long *)(input_buffer + uVar5) * -0x42e1ca5843000000) >> 0x30] = 0;
            uVar5 = uVar5 + 1;
          } while (uVar11 != uVar5);
        }
        else {
          sVar17 = 0x40004;
LAB_00125215:
          memset(__s,0,sVar17);
        }
        break;
      case 3:
        __s = piVar7 + 10;
        if (0x800 < uVar11) {
          sVar17 = 0x40008;
          goto LAB_00125215;
        }
        uVar5 = 0;
        do {
          lVar27 = *(long *)(input_buffer + uVar5);
          (__s + ((ulong)(lVar27 * -0x42e1ca5843000000) >> 0x30))[0] = 0;
          (__s + ((ulong)(lVar27 * -0x42e1ca5843000000) >> 0x30))[1] = 0;
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
        break;
      case 4:
        __s = piVar7 + 10;
        if (0x1000 < uVar11) {
          sVar17 = 0x80010;
          goto LAB_00125215;
        }
        uVar5 = 0;
        do {
          piVar1 = __s + ((ulong)(*(long *)(input_buffer + uVar5) * -0x42e1ca5843000000) >> 0x2f);
          piVar1[0] = 0;
          piVar1[1] = 0;
          piVar1[2] = 0;
          piVar1[3] = 0;
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
        break;
      case 5:
        __s = piVar7 + 0x10;
        if (*(ulong *)(piVar7 + 10) >> 6 < uVar11) {
          sVar17 = *(ulong *)(piVar7 + 10) * 2;
          goto LAB_00125215;
        }
        iVar4 = piVar7[0xe];
        uVar5 = 0;
        do {
          *(undefined2 *)
           ((long)__s +
           (ulong)((uint)(*(int *)(input_buffer + uVar5) * 0x1e35a7bd) >> ((byte)iVar4 & 0x1f)) * 2)
               = 0;
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
        break;
      case 6:
        PrepareH6((HasherHandle)piVar7,1,uVar11,input_buffer);
        break;
      case 10:
        iVar4 = piVar7[0x2000c];
        lVar27 = 0;
        do {
          piVar7[lVar27 + 0xc] = iVar4;
          lVar27 = lVar27 + 1;
        } while (lVar27 != 0x20000);
      }
    }
    else if (iVar4 < 0x2a) {
      if (iVar4 == 0x28) {
        if (uVar11 < 0x201) {
          uVar5 = 0;
          do {
            uVar28 = (ulong)((uint)(*(int *)(input_buffer + uVar5) * 0x1e35a7bd) >> 0x11);
            piVar7[uVar28 + 10] = -0x33333334;
            *(undefined2 *)((long)piVar7 + uVar28 * 2 + 0x20028) = 0xcccc;
            uVar5 = uVar5 + 1;
          } while (uVar11 != uVar5);
        }
        else {
LAB_0012514d:
          memset(piVar7 + 10,0xcc,0x20000);
          memset(piVar7 + 0x800a,0,0x10000);
        }
      }
      else {
        if (iVar4 != 0x29) goto switchD_00124f2f_caseD_7;
        if (0x200 < uVar11) goto LAB_0012514d;
        uVar5 = 0;
        do {
          uVar28 = (ulong)((uint)(*(int *)(input_buffer + uVar5) * 0x1e35a7bd) >> 0x11);
          piVar7[uVar28 + 10] = -0x33333334;
          *(undefined2 *)((long)piVar7 + uVar28 * 2 + 0x20028) = 0xcccc;
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
      }
      memset(piVar7 + 0xc00a,0,0x10000);
      *(undefined2 *)(piVar7 + 0x2000a) = 0;
    }
    else {
      if (iVar4 == 0x2a) {
        if (uVar11 < 0x201) {
          uVar5 = 0;
          do {
            uVar28 = (ulong)((uint)(*(int *)(input_buffer + uVar5) * 0x1e35a7bd) >> 0x11);
            piVar7[uVar28 + 10] = -0x33333334;
            *(undefined2 *)((long)piVar7 + uVar28 * 2 + 0x20028) = 0xcccc;
            uVar5 = uVar5 + 1;
          } while (uVar11 != uVar5);
        }
        else {
          memset(piVar7 + 10,0xcc,0x20000);
          memset(piVar7 + 0x800a,0,0x10000);
        }
        memset(piVar7 + 0xc00a,0,0x10000);
        __s = piVar7 + 0x5000a;
        sVar17 = 0x400;
        goto LAB_00125215;
      }
      if (iVar4 == 0x36) {
        __s = piVar7 + 10;
        if (0x8000 < uVar11) {
          sVar17 = 0x400010;
          goto LAB_00125215;
        }
        uVar5 = 0;
        do {
          piVar1 = __s + ((ulong)(*(long *)(input_buffer + uVar5) * 0x35a7bd1e35a7bd00) >> 0x2c);
          piVar1[0] = 0;
          piVar1[1] = 0;
          piVar1[2] = 0;
          piVar1[3] = 0;
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
      }
    }
switchD_00124f2f_caseD_7:
    piVar7[6] = 0;
    piVar7[7] = 0;
    piVar7[8] = 0;
    piVar7[9] = 0;
    piVar7[5] = 1;
  }
  local_2d0 = local_2d0 - 0x10;
  uVar5 = uVar16 >> 3;
  local_280 = encoded_buffer;
  local_310 = 0;
  prev_byte = '\0';
  prev_byte2 = '\0';
  sVar21 = 0;
  local_2b8 = piVar7;
  do {
    uVar11 = uVar16 + sVar21;
    if (input_size < uVar11) {
      uVar11 = input_size;
    }
    last_insert_len = 0;
    num_literals = 0;
    local_2e0 = sVar21;
    if ((params.quality < 10) ||
       (iVar4 = BrotliIsMostlyUTF8(input_buffer,sVar21,0x7fffffffffffffff,uVar11 - sVar21,0.75),
       iVar4 != 0)) {
      local_2e8 = 2;
    }
    else {
      local_2e8 = 3;
    }
    uVar28 = (uVar11 - sVar21) / 0xc + 0x10;
    local_338 = 0;
    local_2d8 = 0;
    local_330 = 0;
    __src = (Command *)0x0;
    sVar21 = local_2e0;
    while( true ) {
      num_bytes = uVar11 - sVar21;
      cmds = __src;
      uVar8 = local_330;
      if (uVar11 < sVar21 || num_bytes == 0) break;
      if (uVar6 <= num_bytes) {
        num_bytes = uVar6;
      }
      sVar29 = num_bytes + 1;
      local_2c0 = sVar21;
      if (sVar29 == 0) {
        local_2c8 = (ZopfliNode *)0x0;
      }
      else {
        local_2c8 = (ZopfliNode *)BrotliAllocate(&memory_manager,sVar29 * 0x10);
      }
      BrotliInitZopfliNodes(local_2c8,sVar29);
      if ((0x7f < local_2c0) && (2 < num_bytes)) {
        uVar8 = local_2c0 - 0x7f;
        uVar18 = (num_bytes + local_2c0) - 0x7f;
        if (local_2c0 < uVar18) {
          uVar18 = local_2c0;
        }
        if (uVar8 < uVar18) {
          local_2b0 = *(ulong *)(piVar7 + 10);
LAB_00125417:
          uVar12 = local_2c0 - uVar8;
          if (uVar12 < 0x10) {
            uVar12 = 0xf;
          }
          uVar19 = (ulong)((uint)(*(int *)(input_buffer + (uVar8 & 0x7fffffffffffffff)) * 0x1e35a7bd
                                 ) >> 0xf);
          uVar32 = (ulong)(uint)piVar7[uVar19 + 0xc];
          piVar7[uVar19 + 0xc] = (int)uVar8;
          lVar27 = 0x40;
          local_2f8 = 0;
          local_300 = 0;
          uVar19 = (uVar8 & local_2b0) * 2 + 1;
          uVar26 = (uVar8 & local_2b0) * 2;
LAB_0012549c:
          if ((uVar8 != uVar32) && (lVar27 != 0 && uVar8 - uVar32 <= local_2b0 - uVar12)) {
            uVar13 = local_300;
            if (local_2f8 < local_300) {
              uVar13 = local_2f8;
            }
            puVar9 = input_buffer + uVar13 + uVar32;
            uVar20 = 0x80 - uVar13;
            if (7 < uVar20) {
              uVar30 = uVar20 & 0xfffffffffffffff8;
              lVar31 = 0;
              uVar33 = 0;
LAB_00125545:
              piVar7 = local_2b8;
              if (*(ulong *)(puVar9 + uVar33 * 8) ==
                  *(ulong *)(input_buffer + uVar33 * 8 + uVar13 + (uVar8 & 0x7fffffffffffffff)))
              goto code_r0x00125552;
              uVar30 = *(ulong *)(input_buffer + uVar33 * 8 + uVar13 + (uVar8 & 0x7fffffffffffffff))
                       ^ *(ulong *)(puVar9 + uVar33 * 8);
              uVar20 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar33 = (uVar20 >> 3 & 0x1fffffff) - lVar31;
              goto LAB_001255bc;
            }
            uVar30 = 0;
            goto LAB_0012564f;
          }
          piVar7[uVar26 + 0x2000e] = piVar7[0x2000c];
          iVar4 = piVar7[0x2000c];
          goto LAB_001254cd;
        }
      }
LAB_001256ab:
      sVar21 = BrotliZopfliComputeShortestPath
                         (&memory_manager,num_bytes,local_2c0,input_buffer,0x7fffffffffffffff,
                          &params,local_2d0,dist_cache,(HasherHandle)piVar7,local_2c8);
      uVar8 = sVar21 + local_330 + 1;
      if (uVar8 < uVar28) {
        uVar8 = uVar28;
      }
      uVar18 = local_2d8;
      if ((local_2d8 != uVar8) &&
         (cmds = (Command *)BrotliAllocate(&memory_manager,uVar8 << 4), uVar18 = uVar8,
         __src != (Command *)0x0)) {
        memcpy(cmds,__src,local_330 << 4);
        BrotliFree(&memory_manager,__src);
      }
      local_2d8 = uVar18;
      uVar18 = local_2c0;
      uVar8 = sVar21 + local_330;
      BrotliZopfliCreateCommands
                (num_bytes,local_2c0,local_2d0,local_2c8,dist_cache,&last_insert_len,&params,
                 cmds + local_330,&num_literals);
      local_338 = local_338 + num_bytes;
      BrotliFree(&memory_manager,local_2c8);
      if ((uVar5 < uVar8) ||
         (sVar21 = uVar18 + num_bytes, __src = cmds, local_330 = uVar8, uVar5 < num_literals))
      break;
    }
    sVar21 = local_2e0;
    uVar11 = uVar8;
    if (last_insert_len != 0) {
      cmds[uVar8].insert_len_ = (uint32_t)last_insert_len;
      cmds[uVar8].copy_len_ = 0x8000000;
      cmds[uVar8].dist_extra_ = 0;
      cmds[uVar8].dist_prefix_ = 0x10;
      if (last_insert_len < 6) {
        uVar28 = last_insert_len & 0xffffffff;
      }
      else if (last_insert_len < 0x82) {
        uVar3 = 0x1f;
        uVar14 = (uint)(last_insert_len - 2);
        if (uVar14 != 0) {
          for (; uVar14 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar28 = (ulong)((int)(last_insert_len - 2 >> ((char)(uVar3 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar3 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (last_insert_len < 0x842) {
        uVar14 = (uint32_t)last_insert_len - 0x42;
        uVar3 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar28 = (ulong)((uVar3 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar28 = 0x15;
        if (0x1841 < last_insert_len) {
          uVar28 = (ulong)(ushort)(0x17 - (last_insert_len < 0x5842));
        }
      }
      uVar11 = uVar8 + 1;
      iVar4 = (int)((uVar28 & 0xffff) >> 3) * 3;
      cmds[uVar8].cmd_prefix_ =
           ((ushort)(0x520d40 >> ((char)iVar4 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar4 * 0x40 +
           ((ushort)uVar28 & 7) * 8 + 0x42;
      num_literals = num_literals + last_insert_len;
    }
    local_350 = local_338 + local_2e0;
    local_360 = uVar24;
    if (local_338 == 0) {
      puVar9 = (uint8_t *)BrotliAllocate(&memory_manager,0x10);
      *(short *)puVar9 = (short)local_348;
      *(ulong *)(puVar9 + (local_360 >> 3)) =
           3L << ((byte)local_360 & 7) | (ulong)puVar9[local_360 >> 3];
      local_360 = (ulong)((int)local_360 + 9U & 0xfffffff8);
    }
    else {
      local_358 = (ulong)(local_350 == input_size);
      iVar4 = ShouldCompress(input_buffer,0x7fffffffffffffff,local_2e0,local_338,num_literals,uVar11
                            );
      sVar29 = local_338;
      if (iVar4 == 0) {
        dist_cache[0] = saved_dist_cache[0];
        dist_cache[1] = saved_dist_cache[1];
        dist_cache[2] = saved_dist_cache[2];
        dist_cache[3] = saved_dist_cache[3];
        puVar9 = (uint8_t *)BrotliAllocate(&memory_manager,local_338 + 0x10);
        *(short *)puVar9 = (short)local_348;
        BrotliStoreUncompressedMetaBlock
                  ((int)local_358,input_buffer,sVar21,0x7fffffffffffffff,sVar29,&local_360,puVar9);
      }
      else {
        pBVar23 = &params;
        psVar25 = &available_out;
        for (lVar27 = 0x10; lVar27 != 0; lVar27 = lVar27 + -1) {
          *psVar25 = *(size_t *)pBVar23;
          pBVar23 = (BrotliEncoderParams *)((long)pBVar23 + (ulong)bVar34 * -0x10 + 8);
          psVar25 = psVar25 + (ulong)bVar34 * -2 + 1;
        }
        BrotliInitBlockSplit((BlockSplit *)&available_in);
        BrotliInitBlockSplit(&local_160);
        BrotliInitBlockSplit(&local_130);
        local_c0 = (HistogramDistance *)0x0;
        sStack_b8 = 0;
        local_d0 = (HistogramCommand *)0x0;
        sStack_c8 = 0;
        local_e0 = (HistogramLiteral *)0x0;
        sStack_d8 = 0;
        local_f0 = (uint32_t *)0x0;
        sStack_e8 = 0;
        local_100 = (uint32_t *)0x0;
        sStack_f8 = 0;
        BrotliBuildMetaBlock
                  (&memory_manager,input_buffer,sVar21,0x7fffffffffffffff,
                   (BrotliEncoderParams *)&available_out,prev_byte,prev_byte2,cmds,uVar11,
                   (ContextType)local_2e8,(MetaBlockSplit *)&available_in);
        num_distance_codes = local_70;
        if (0x21f < local_70) {
          num_distance_codes = 0x220;
        }
        BrotliOptimizeHistograms(num_distance_codes,(MetaBlockSplit *)&available_in);
        sVar21 = local_338;
        puVar9 = (uint8_t *)BrotliAllocate(&memory_manager,local_338 * 2 + 0x1f7);
        sVar29 = local_2e0;
        *(short *)puVar9 = (short)local_348;
        iVar4 = (int)local_358;
        BrotliStoreMetaBlock
                  (&memory_manager,input_buffer,local_2e0,sVar21,0x7fffffffffffffff,prev_byte,
                   prev_byte2,iVar4,(BrotliEncoderParams *)&available_out,(ContextType)local_2e8,
                   cmds,uVar11,(MetaBlockSplit *)&available_in,&local_360,puVar9);
        if (sVar21 + 4 < local_360 >> 3) {
          dist_cache[0] = saved_dist_cache[0];
          dist_cache[1] = saved_dist_cache[1];
          dist_cache[2] = saved_dist_cache[2];
          dist_cache[3] = saved_dist_cache[3];
          *puVar9 = (uint8_t)local_348;
          puVar9[1] = (uint8_t)(local_348 >> 8);
          local_360 = uVar24;
          BrotliStoreUncompressedMetaBlock
                    (iVar4,input_buffer,sVar29,0x7fffffffffffffff,sVar21,&local_360,puVar9);
        }
        BrotliDestroyBlockSplit(&memory_manager,(BlockSplit *)&available_in);
        BrotliDestroyBlockSplit(&memory_manager,&local_160);
        BrotliDestroyBlockSplit(&memory_manager,&local_130);
        BrotliFree(&memory_manager,local_100);
        local_100 = (uint32_t *)0x0;
        BrotliFree(&memory_manager,local_f0);
        local_f0 = (uint32_t *)0x0;
        BrotliFree(&memory_manager,local_e0);
        local_e0 = (HistogramLiteral *)0x0;
        BrotliFree(&memory_manager,local_d0);
        local_d0 = (HistogramCommand *)0x0;
        BrotliFree(&memory_manager,local_c0);
      }
    }
    piVar7 = local_2b8;
    uVar11 = local_360;
    uVar24 = local_360 >> 3;
    local_348 = (ulong)puVar9[uVar24];
    if (local_350 < input_size) {
      prev_byte2 = input_buffer[local_350 - 2];
      prev_byte = input_buffer[local_350 - 1];
    }
    saved_dist_cache[0] = dist_cache[0];
    saved_dist_cache[1] = dist_cache[1];
    saved_dist_cache[2] = dist_cache[2];
    saved_dist_cache[3] = dist_cache[3];
    local_310 = local_310 + uVar24;
    if (local_310 <= local_340) {
      memcpy(local_280,puVar9,uVar24);
      local_280 = local_280 + uVar24;
    }
    BrotliFree(&memory_manager,puVar9);
    BrotliFree(&memory_manager,cmds);
  } while ((local_350 < input_size) &&
          (uVar24 = (ulong)((uint)uVar11 & 7), sVar21 = local_350, local_310 <= local_340));
  *encoded_size = local_310;
  BrotliFree(&memory_manager,piVar7);
  if (local_310 <= local_340) {
    if (uVar15 == 0) {
      return 1;
    }
    if (*encoded_size <= uVar15) {
      return 1;
    }
  }
LAB_00125db4:
  *encoded_size = 0;
  if (uVar15 - 1 < local_340) {
    encoded_buffer[0] = '!';
    encoded_buffer[1] = '\x03';
    lVar27 = 2;
    lVar31 = 0;
    do {
      sVar17 = 0x1000000;
      if (input_size < 0x1000000) {
        sVar17 = input_size;
      }
      iVar4 = 2 - (uint)(input_size < 0x100001);
      if (input_size < 0x10001) {
        iVar4 = 0;
      }
      uVar14 = ((int)sVar17 * 8 + iVar4 * 2) - 8;
      uVar3 = 0x80000 << ((byte)(iVar4 << 2) & 0x1f) | uVar14;
      encoded_buffer[lVar27] = (uint8_t)uVar14;
      encoded_buffer[lVar27 + 1] = (uint8_t)((uint)((int)sVar17 * 8 + -8) >> 8);
      encoded_buffer[lVar27 + 2] = (uint8_t)(uVar3 >> 0x10);
      if (input_size < 0x100001) {
        lVar27 = lVar27 + 3;
      }
      else {
        encoded_buffer[lVar27 + 3] = (uint8_t)(uVar3 >> 0x18);
        lVar27 = lVar27 + 4;
      }
      memcpy(encoded_buffer + lVar27,input_buffer + lVar31,sVar17);
      lVar27 = lVar27 + sVar17;
      lVar31 = lVar31 + sVar17;
      input_size = input_size - sVar17;
    } while (input_size != 0);
    encoded_buffer[lVar27] = '\x03';
    *encoded_size = lVar27 + 1;
    return 1;
  }
  return 0;
code_r0x00125552:
  uVar33 = uVar33 + 1;
  lVar31 = lVar31 + -8;
  if (uVar20 >> 3 == uVar33) goto code_r0x0012555e;
  goto LAB_00125545;
code_r0x0012555e:
  puVar9 = puVar9 + -lVar31;
LAB_0012564f:
  uVar20 = uVar20 & 7;
  uVar33 = uVar30;
  if (uVar20 != 0) {
    uVar22 = uVar30 | uVar20;
    do {
      uVar33 = uVar30;
      if (input_buffer[uVar30 + uVar13 + (uVar8 & 0x7fffffffffffffff)] != *puVar9) break;
      puVar9 = puVar9 + 1;
      uVar30 = uVar30 + 1;
      uVar20 = uVar20 - 1;
      uVar33 = uVar22;
    } while (uVar20 != 0);
  }
LAB_001255bc:
  uVar33 = uVar33 + uVar13;
  local_358 = uVar26;
  local_350 = uVar19;
  if (uVar33 < 0x80) {
    uVar13 = (uVar32 & local_2b0) * 2;
    if (input_buffer[uVar33 + uVar32] < input_buffer[uVar33 + (uVar8 & 0x7fffffffffffffff)]) {
      piVar7[uVar26 + 0x2000e] = (int)uVar32;
      uVar13 = uVar13 | 1;
      uVar26 = uVar13;
      local_2f8 = uVar33;
    }
    else {
      piVar7[uVar19 + 0x2000e] = (int)uVar32;
      uVar19 = uVar13;
      local_300 = uVar33;
    }
    uVar32 = (ulong)(uint)piVar7[uVar13 + 0x2000e];
    bVar2 = true;
  }
  else {
    piVar7[uVar26 + 0x2000e] = piVar7[(uVar32 & local_2b0) * 2 + 0x2000e];
    iVar4 = piVar7[(uVar32 & local_2b0) * 2 + 0x2000f];
LAB_001254cd:
    piVar7[uVar19 + 0x2000e] = iVar4;
    bVar2 = false;
  }
  lVar27 = lVar27 + -1;
  if (!bVar2) goto LAB_00125692;
  goto LAB_0012549c;
LAB_00125692:
  uVar8 = uVar8 + 1;
  if (uVar8 == uVar18) goto LAB_001256ab;
  goto LAB_00125417;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompress(
    int quality, int lgwin, BrotliEncoderMode mode, size_t input_size,
    const uint8_t* input_buffer, size_t* encoded_size,
    uint8_t* encoded_buffer) {
  BrotliEncoderState* s;
  size_t out_size = *encoded_size;
  const uint8_t* input_start = input_buffer;
  uint8_t* output_start = encoded_buffer;
  size_t max_out_size = BrotliEncoderMaxCompressedSize(input_size);
  if (out_size == 0) {
    /* Output buffer needs at least one byte. */
    return BROTLI_FALSE;
  }
  if (input_size == 0) {
    /* Handle the special case of empty input. */
    *encoded_size = 1;
    *encoded_buffer = 6;
    return BROTLI_TRUE;
  }
  if (quality == 10) {
    /* TODO: Implement this direct path for all quality levels. */
    const int lg_win = BROTLI_MIN(int, BROTLI_LARGE_MAX_WINDOW_BITS,
                                       BROTLI_MAX(int, 16, lgwin));
    int ok = BrotliCompressBufferQuality10(lg_win, input_size, input_buffer,
                                           encoded_size, encoded_buffer);
    if (!ok || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }

  s = BrotliEncoderCreateInstance(0, 0, 0);
  if (!s) {
    return BROTLI_FALSE;
  } else {
    size_t available_in = input_size;
    const uint8_t* next_in = input_buffer;
    size_t available_out = *encoded_size;
    uint8_t* next_out = encoded_buffer;
    size_t total_out = 0;
    BROTLI_BOOL result = BROTLI_FALSE;
    BrotliEncoderSetParameter(s, BROTLI_PARAM_QUALITY, (uint32_t)quality);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, (uint32_t)lgwin);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_MODE, (uint32_t)mode);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, (uint32_t)input_size);
    if (lgwin > BROTLI_MAX_WINDOW_BITS) {
      BrotliEncoderSetParameter(s, BROTLI_PARAM_LARGE_WINDOW, BROTLI_TRUE);
    }
    result = BrotliEncoderCompressStream(s, BROTLI_OPERATION_FINISH,
        &available_in, &next_in, &available_out, &next_out, &total_out);
    if (!BrotliEncoderIsFinished(s)) result = 0;
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if (!result || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }
fallback:
  *encoded_size = 0;
  if (!max_out_size) return BROTLI_FALSE;
  if (out_size >= max_out_size) {
    *encoded_size =
        MakeUncompressedStream(input_start, input_size, output_start);
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}